

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O2

Transform * __thiscall SceneParser::parseTransform(SceneParser *this)

{
  float sy;
  long lVar1;
  int iVar2;
  float *pfVar3;
  Object3D *obj;
  Transform *this_00;
  int i;
  int i_00;
  int j;
  float fVar4;
  Vector3f axis;
  Matrix4f matrix;
  Matrix4f local_118;
  char token [100];
  Matrix4f matrix2;
  
  Matrix4f::identity();
  getToken(this,token);
  if (token._0_2_ != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1b7,"Transform *SceneParser::parseTransform()");
  }
  do {
    while( true ) {
      getToken(this,token);
      iVar2 = bcmp(token,"Scale",6);
      if (iVar2 != 0) break;
      readVector3f((SceneParser *)&axis);
      pfVar3 = Vector3f::operator[](&axis,0);
      fVar4 = *pfVar3;
      pfVar3 = Vector3f::operator[](&axis,1);
      sy = *pfVar3;
      pfVar3 = Vector3f::operator[](&axis,2);
      Matrix4f::scaling(&local_118,fVar4,sy,*pfVar3);
LAB_0012670b:
      ::operator*(&matrix2,&matrix,&local_118);
LAB_001267ba:
      Matrix4f::operator=(&matrix,&matrix2);
    }
    iVar2 = bcmp(token,"UniformScale",0xd);
    if (iVar2 == 0) {
      fVar4 = readFloat(this);
      Matrix4f::uniformScaling(fVar4);
      goto LAB_0012670b;
    }
    iVar2 = bcmp(token,"Translate",10);
    if (iVar2 == 0) {
      readVector3f((SceneParser *)&axis);
      Matrix4f::translation(&local_118,&axis);
LAB_001267a4:
      ::operator*(&matrix2,&matrix,&local_118);
      goto LAB_001267ba;
    }
    lVar1 = CONCAT62(token._2_6_,token._0_2_);
    if (lVar1 == 0x657461746f525a) {
      fVar4 = readFloat(this);
      Matrix4f::rotateZ(&local_118,(fVar4 * 3.1415927) / 180.0);
      goto LAB_001267a4;
    }
    if (lVar1 == 0x657461746f5259) {
      fVar4 = readFloat(this);
      Matrix4f::rotateY(&local_118,(fVar4 * 3.1415927) / 180.0);
      goto LAB_001267a4;
    }
    if (lVar1 == 0x657461746f5258) {
      fVar4 = readFloat(this);
      Matrix4f::rotateX(&local_118,(fVar4 * 3.1415927) / 180.0);
      goto LAB_001267a4;
    }
    iVar2 = bcmp(token,"Rotate",7);
    if (iVar2 == 0) {
      getToken(this,token);
      if (token._0_2_ != 0x7b) {
        __assert_fail("!strcmp(token, \"{\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                      ,0x1ce,"Transform *SceneParser::parseTransform()");
      }
      readVector3f((SceneParser *)&axis);
      fVar4 = readFloat(this);
      Matrix4f::rotation(&local_118,&axis,(fVar4 * 3.1415927) / 180.0);
      ::operator*(&matrix2,&matrix,&local_118);
      Matrix4f::operator=(&matrix,&matrix2);
      getToken(this,token);
      if (token._0_2_ != 0x7d) {
        __assert_fail("!strcmp(token, \"}\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                      ,0x1d4,"Transform *SceneParser::parseTransform()");
      }
    }
    else {
      iVar2 = bcmp(token,"Matrix4f",9);
      if (iVar2 != 0) {
        obj = parseObject(this,token);
        getToken(this,token);
        if (token._0_2_ == 0x7d) {
          this_00 = (Transform *)operator_new(0xb8);
          Transform::Transform(this_00,&matrix,obj);
          return this_00;
        }
        __assert_fail("!strcmp(token, \"}\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                      ,0x1ed,"Transform *SceneParser::parseTransform()");
      }
      Matrix4f::identity();
      getToken(this,token);
      if (token._0_2_ != 0x7b) {
        __assert_fail("!strcmp(token, \"{\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                      ,0x1d8,"Transform *SceneParser::parseTransform()");
      }
      for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
        for (i_00 = 0; i_00 != 4; i_00 = i_00 + 1) {
          fVar4 = readFloat(this);
          pfVar3 = Matrix4f::operator()(&matrix2,i_00,iVar2);
          *pfVar3 = fVar4;
        }
      }
      getToken(this,token);
      if (token._0_2_ != 0x7d) {
        __assert_fail("!strcmp(token, \"}\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                      ,0x1e0,"Transform *SceneParser::parseTransform()");
      }
      ::operator*(&local_118,&matrix2,&matrix);
      Matrix4f::operator=(&matrix,&local_118);
    }
  } while( true );
}

Assistant:

Transform *
SceneParser::parseTransform() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    Matrix4f matrix = Matrix4f::identity();
    Object3D *object = NULL;
    getToken(token);
    assert(!strcmp(token, "{"));

    // Read in transformations:
    // apply to the LEFT side of the current matrix (so the first
    // transform in the list is the last applied to the object).
    getToken(token);
    while (true) {
        if (!strcmp(token, "Scale")) {
            Vector3f s = readVector3f();
            matrix = matrix * Matrix4f::scaling(s[0], s[1], s[2]);
        } else if (!strcmp(token, "UniformScale")) {
            float s = readFloat();
            matrix = matrix * Matrix4f::uniformScaling(s);
        } else if (!strcmp(token, "Translate")) {
            matrix = matrix * Matrix4f::translation(readVector3f());
        } else if (!strcmp(token, "XRotate")) {
            matrix = matrix * Matrix4f::rotateX((float) DegreesToRadians(readFloat()));
        } else if (!strcmp(token, "YRotate")) {
            matrix = matrix * Matrix4f::rotateY((float) DegreesToRadians(readFloat()));
        } else if (!strcmp(token, "ZRotate")) {
            matrix = matrix * Matrix4f::rotateZ((float) DegreesToRadians(readFloat()));
        } else if (!strcmp(token, "Rotate")) {
            getToken(token);
            assert(!strcmp(token, "{"));
            Vector3f axis = readVector3f();
            float degrees = readFloat();
            float radians = (float) DegreesToRadians(degrees);
            matrix = matrix * Matrix4f::rotation(axis, radians);
            getToken(token);
            assert(!strcmp(token, "}"));
        } else if (!strcmp(token, "Matrix4f")) {
            Matrix4f matrix2 = Matrix4f::identity();
            getToken(token);
            assert(!strcmp(token, "{"));
            for (int j = 0; j < 4; j++) {
                for (int i = 0; i < 4; i++) {
                    float v = readFloat();
                    matrix2(i, j) = v;
                }
            }
            getToken(token);
            assert(!strcmp(token, "}"));
            matrix = matrix2 * matrix;
        } else {
            // Otherwise this must be an object,
            // and there are no more transformations.
            object = parseObject(token);
            break;
        }
        getToken(token);
    }

    assert(object != NULL);
    getToken(token);
    assert(!strcmp(token, "}"));
    return new Transform(matrix, object);
}